

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry_test.cpp
# Opt level: O1

void __thiscall
test::test_most_advanced_license_error::test_method(test_most_advanced_license_error *this)

{
  int iVar1;
  EventRegistry er;
  shared_count sStack_158;
  char *local_150;
  undefined **local_148;
  undefined1 local_140;
  undefined1 *local_138;
  char *local_130;
  undefined1 local_128;
  undefined8 local_120;
  shared_count sStack_118;
  EventRegistry local_110;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  license::EventRegistry::EventRegistry(&local_110);
  license::EventRegistry::addEvent(&local_110,LICENSE_SPECIFIED,"lic2",(char *)0x0);
  license::EventRegistry::addEvent(&local_110,LICENSE_FOUND,"lic1",(char *)0x0);
  license::EventRegistry::addEvent(&local_110,LICENSE_CORRUPTED,"lic1",(char *)0x0);
  license::EventRegistry::turnWarningsIntoErrors(&local_110);
  license::EventRegistry::getLastFailure(&local_110);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/EventRegistry_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x22);
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_001c2458;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "An error is detected";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/EventRegistry_test.cpp"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_158);
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/EventRegistry_test.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x23);
  local_148 = &local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"lic1","");
  iVar1 = std::__cxx11::string::compare((char *)&local_148);
  local_128 = iVar1 == 0;
  local_120 = 0;
  sStack_118.pi_ = (sp_counted_base *)0x0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "Error is for lic1";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/EventRegistry_test.cpp"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_118);
  if (local_148 != &local_138) {
    operator_delete(local_148);
  }
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/EventRegistry_test.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x24);
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_001c2510;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "Error is for LICENSE_CORRUPTED";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/EventRegistry_test.cpp"
  ;
  local_b8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_158);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_110.mostAdvancedLogIdx_by_LicenseId._M_t);
  if (local_110.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer_conflict)0x0) {
    operator_delete(local_110.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_most_advanced_license_error) {
	EventRegistry er;
	er.addEvent(LICENSE_SPECIFIED, "lic2");
	er.addEvent(LICENSE_FOUND, "lic1");
	er.addEvent(LICENSE_CORRUPTED, "lic1");
	er.turnWarningsIntoErrors();
	const AuditEvent *event = er.getLastFailure();
	BOOST_CHECK_MESSAGE(event != nullptr, "An error is detected");
	BOOST_CHECK_MESSAGE(string("lic1") == event->license_reference, "Error is for lic1");
	BOOST_CHECK_MESSAGE(LICENSE_CORRUPTED == event->event_type, "Error is for LICENSE_CORRUPTED");
}